

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int string_query(lua_State *L)

{
  global_State *pgVar1;
  StkId pTVar2;
  int iVar3;
  lua_Integer lVar4;
  TString *x_;
  TValue *io;
  TString *pTStack_30;
  int n;
  TString *ts;
  int s;
  stringtable *tb;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  lVar4 = luaL_optinteger(L,1,0);
  iVar3 = (int)lVar4 + -1;
  if (iVar3 == -1) {
    lua_pushinteger(L,(long)(pgVar1->strt).size);
    lua_pushinteger(L,(long)(pgVar1->strt).nuse);
    L_local._4_4_ = 2;
  }
  else if (iVar3 < (pgVar1->strt).size) {
    io._4_4_ = 0;
    for (pTStack_30 = (pgVar1->strt).hash[iVar3]; pTStack_30 != (TString *)0x0;
        pTStack_30 = (pTStack_30->u).hnext) {
      pTVar2 = L->top;
      if (9 < (pTStack_30->tt & 0xf)) {
        __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x36b,"int string_query(lua_State *)");
      }
      (pTVar2->value_).gc = (GCObject *)pTStack_30;
      pTVar2->tt_ = pTStack_30->tt | 0x8000;
      if ((pTVar2->tt_ & 0x8000) != 0) {
        if ((pTVar2->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x36b,"int string_query(lua_State *)");
        }
        if ((pTVar2->tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_001863bb:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x36b,"int string_query(lua_State *)");
        }
        if (L != (lua_State *)0x0) {
          if ((pTVar2->tt_ & 0x8000) == 0) {
            __assert_fail("(((io)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x36b,"int string_query(lua_State *)");
          }
          if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_001863bb;
        }
      }
      L->top = L->top + 1;
      if (L->ci->top < L->top) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x36c,"int string_query(lua_State *)");
      }
      io._4_4_ = io._4_4_ + 1;
    }
    L_local._4_4_ = io._4_4_;
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int string_query (lua_State *L) {
  stringtable *tb = &G(L)->strt;
  int s = cast_int(luaL_optinteger(L, 1, 0)) - 1;
  if (s == -1) {
    lua_pushinteger(L ,tb->size);
    lua_pushinteger(L ,tb->nuse);
    return 2;
  }
  else if (s < tb->size) {
    TString *ts;
    int n = 0;
    for (ts = tb->hash[s]; ts != NULL; ts = ts->u.hnext) {
      setsvalue2s(L, L->top, ts);
      api_incr_top(L);
      n++;
    }
    return n;
  }
  else return 0;
}